

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_backup_step(sqlite3_backup *p,int nPage)

{
  u8 uVar1;
  u32 uVar2;
  sqlite3_mutex *psVar3;
  Btree *pBVar4;
  BtShared *pBVar5;
  BtShared *pBVar6;
  Pager *pPVar7;
  sqlite3_file *psVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  Pgno PVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  DbPage *pSrcPg;
  Pager *local_68;
  u32 local_5c;
  sqlite3_file *local_58;
  long local_50;
  ulong local_48;
  undefined8 local_40;
  Pager *local_38;
  
  psVar3 = p->pSrcDb->mutex;
  if (psVar3 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar3);
  }
  sqlite3BtreeEnter(p->pSrc);
  if ((p->pDestDb != (sqlite3 *)0x0) && (psVar3 = p->pDestDb->mutex, psVar3 != (sqlite3_mutex *)0x0)
     ) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar3);
  }
  uVar11 = p->rc;
  if ((6 < uVar11) || ((0x61U >> (uVar11 & 0x1f) & 1) == 0)) goto LAB_00131ecd;
  pBVar4 = p->pSrc;
  local_38 = pBVar4->pBt->pPager;
  local_68 = p->pDest->pBt->pPager;
  if ((p->pDestDb == (sqlite3 *)0x0) || (pBVar4->pBt->inTransaction != '\x02')) {
    if (pBVar4->inTrans != '\0') {
      uVar11 = 0;
      goto LAB_00131ac6;
    }
    local_40 = 0;
    uVar11 = sqlite3BtreeBeginTrans(pBVar4,0,(int *)0x0);
  }
  else {
    uVar11 = 5;
LAB_00131ac6:
    local_40 = CONCAT71((int7)((ulong)local_68 >> 8),1);
  }
  iVar10 = p->bDestLocked;
  if (iVar10 == 0 && uVar11 == 0) {
    iVar10 = sqlite3BtreeSetPageSize(p->pDest,p->pSrc->pBt->pageSize,-1,0);
    uVar11 = 7;
    if (iVar10 != 7) {
      iVar10 = p->bDestLocked;
LAB_00131b18:
      uVar11 = 0;
      if ((iVar10 == 0) &&
         (uVar11 = sqlite3BtreeBeginTrans(p->pDest,2,(int *)&p->iDestSchema), uVar11 == 0)) {
        p->bDestLocked = 1;
        uVar11 = 0;
      }
    }
  }
  else if (uVar11 == 0) goto LAB_00131b18;
  pBVar5 = p->pSrc->pBt;
  uVar2 = pBVar5->pageSize;
  local_48 = (ulong)(int)uVar2;
  pBVar6 = p->pDest->pBt;
  local_5c = pBVar6->pageSize;
  uVar1 = pBVar6->pPager->journalMode;
  local_58 = (sqlite3_file *)CONCAT71(local_58._1_7_,uVar1);
  uVar12 = (uint)(uVar2 != local_5c) << 3;
  if (uVar1 != '\x05') {
    uVar12 = uVar11;
  }
  if (uVar11 != 0) {
    uVar12 = uVar11;
  }
  uVar11 = pBVar5->nPage;
  iVar10 = 0;
  while (((iVar10 < nPage || nPage < 0 && (PVar13 = p->iNext, PVar13 <= uVar11)) && (uVar12 == 0)))
  {
    uVar12 = 0;
    if (PVar13 != (uint)sqlite3PendingByte / p->pSrc->pBt->pageSize + 1) {
      uVar12 = (*local_38->xGet)(local_38,PVar13,&pSrcPg,2);
      if (uVar12 == 0) {
        uVar12 = backupOnePage(p,PVar13,(u8 *)pSrcPg->pData,0);
        sqlite3PagerUnref(pSrcPg);
      }
      PVar13 = p->iNext;
    }
    p->iNext = PVar13 + 1;
    iVar10 = iVar10 + 1;
  }
  if (uVar12 == 0x65) {
LAB_00131c36:
    if (uVar11 == 0) {
      uVar11 = 1;
      pBVar4 = p->pDest;
      sqlite3BtreeEnter(pBVar4);
      pBVar5 = pBVar4->pBt;
      pBVar5->nPage = 0;
      uVar12 = newDatabase(pBVar5);
      sqlite3BtreeLeave(pBVar4);
      if ((uVar12 != 0x65) && (uVar12 != 0)) goto LAB_00131e9f;
    }
    uVar12 = sqlite3BtreeUpdateMeta(p->pDest,1,p->iDestSchema + 1);
    if (uVar12 == 0) {
      if (p->pDestDb != (sqlite3 *)0x0) {
        sqlite3ResetAllSchemasOfConnection(p->pDestDb);
      }
      if (((char)local_58 != '\x05') || (uVar12 = sqlite3BtreeSetVersion(p->pDest,2), uVar12 == 0))
      {
        iVar10 = (int)local_48;
        if (iVar10 < (int)local_5c) {
          iVar10 = (int)(uVar11 + (int)local_5c / iVar10 + -1) / ((int)local_5c / iVar10);
          uVar12 = 0;
          local_50 = (long)(int)uVar11;
          local_58 = local_68->fd;
          uVar11 = local_68->dbSize;
          for (PVar13 = iVar10 - (uint)(iVar10 ==
                                       (uint)sqlite3PendingByte / p->pDest->pBt->pageSize + 1);
              (uVar12 == 0 && (PVar13 <= uVar11)); PVar13 = PVar13 + 1) {
            uVar12 = 0;
            if ((PVar13 != (uint)sqlite3PendingByte / p->pDest->pBt->pageSize + 1) &&
               (uVar12 = (*local_68->xGet)(local_68,PVar13,&pSrcPg,0), uVar12 == 0)) {
              uVar12 = sqlite3PagerWrite(pSrcPg);
              sqlite3PagerUnref(pSrcPg);
            }
          }
          lVar14 = local_50 * local_48;
          if (uVar12 == 0) {
            uVar12 = sqlite3PagerCommitPhaseOne(local_68,(char *)0x0,1);
          }
          uVar9 = local_48;
          lVar16 = (long)(int)(local_5c + sqlite3PendingByte);
          if (lVar14 < (int)(local_5c + sqlite3PendingByte)) {
            lVar16 = lVar14;
          }
          iVar10 = (int)local_48;
          local_50 = lVar14;
          for (lVar15 = (long)(sqlite3PendingByte + iVar10);
              (psVar8 = local_58, uVar12 == 0 && (lVar15 < lVar16)); lVar15 = lVar15 + uVar9) {
            pSrcPg = (DbPage *)0x0;
            uVar12 = (*local_38->xGet)(local_38,(int)(lVar15 / (long)uVar9) + 1,&pSrcPg,0);
            if (uVar12 == 0) {
              uVar12 = (*local_58->pMethods->xWrite)(local_58,pSrcPg->pData,iVar10,lVar15);
            }
            sqlite3PagerUnref(pSrcPg);
          }
          if (((uVar12 != 0) ||
              (uVar12 = (*local_58->pMethods->xFileSize)(local_58,(sqlite3_int64 *)&pSrcPg),
              uVar12 != 0)) ||
             ((local_50 < (long)pSrcPg &&
              (uVar12 = (*psVar8->pMethods->xTruncate)(psVar8,local_50), uVar12 != 0))))
          goto LAB_00131e9f;
          uVar12 = sqlite3PagerSync(local_68,(char *)0x0);
        }
        else {
          local_68->dbSize =
               (int)((long)((ulong)(uint)(iVar10 >> 0x1f) << 0x20 | local_48 & 0xffffffff) /
                    (long)(int)local_5c) * uVar11;
          uVar12 = sqlite3PagerCommitPhaseOne(local_68,(char *)0x0,0);
        }
        if (uVar12 == 0) {
          uVar11 = sqlite3BtreeCommitPhaseTwo(p->pDest,0);
          uVar12 = 0x65;
          if (uVar11 != 0) {
            uVar12 = uVar11;
          }
        }
      }
    }
  }
  else if (uVar12 == 0) {
    p->nPagecount = uVar11;
    p->nRemaining = (uVar11 - p->iNext) + 1;
    if (uVar11 < p->iNext) goto LAB_00131c36;
    uVar12 = 0;
    if (p->isAttached == 0) {
      pPVar7 = p->pSrc->pBt->pPager;
      p->pNext = pPVar7->pBackup;
      pPVar7->pBackup = p;
      p->isAttached = 1;
    }
  }
LAB_00131e9f:
  if ((char)local_40 == '\0') {
    sqlite3BtreeCommitPhaseOne(p->pSrc,(char *)0x0);
    sqlite3BtreeCommitPhaseTwo(p->pSrc,0);
  }
  uVar11 = 7;
  if (uVar12 != 0xc0a) {
    uVar11 = uVar12;
  }
  p->rc = uVar11;
LAB_00131ecd:
  if ((p->pDestDb != (sqlite3 *)0x0) && (psVar3 = p->pDestDb->mutex, psVar3 != (sqlite3_mutex *)0x0)
     ) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar3);
  }
  sqlite3BtreeLeave(p->pSrc);
  psVar3 = p->pSrcDb->mutex;
  if (psVar3 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar3);
  }
  return uVar11;
}

Assistant:

SQLITE_API int sqlite3_backup_step(sqlite3_backup *p, int nPage){
  int rc;
  int destMode;       /* Destination journal mode */
  int pgszSrc = 0;    /* Source page size */
  int pgszDest = 0;   /* Destination page size */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( p==0 ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(p->pSrcDb->mutex);
  sqlite3BtreeEnter(p->pSrc);
  if( p->pDestDb ){
    sqlite3_mutex_enter(p->pDestDb->mutex);
  }

  rc = p->rc;
  if( !isFatalError(rc) ){
    Pager * const pSrcPager = sqlite3BtreePager(p->pSrc);     /* Source pager */
    Pager * const pDestPager = sqlite3BtreePager(p->pDest);   /* Dest pager */
    int ii;                            /* Iterator variable */
    int nSrcPage = -1;                 /* Size of source db in pages */
    int bCloseTrans = 0;               /* True if src db requires unlocking */

    /* If the source pager is currently in a write-transaction, return
    ** SQLITE_BUSY immediately.
    */
    if( p->pDestDb && p->pSrc->pBt->inTransaction==TRANS_WRITE ){
      rc = SQLITE_BUSY;
    }else{
      rc = SQLITE_OK;
    }

    /* If there is no open read-transaction on the source database, open
    ** one now. If a transaction is opened here, then it will be closed
    ** before this function exits.
    */
    if( rc==SQLITE_OK && 0==sqlite3BtreeIsInReadTrans(p->pSrc) ){
      rc = sqlite3BtreeBeginTrans(p->pSrc, 0, 0);
      bCloseTrans = 1;
    }

    /* If the destination database has not yet been locked (i.e. if this
    ** is the first call to backup_step() for the current backup operation),
    ** try to set its page size to the same as the source database. This
    ** is especially important on ZipVFS systems, as in that case it is
    ** not possible to create a database file that uses one page size by
    ** writing to it with another.  */
    if( p->bDestLocked==0 && rc==SQLITE_OK && setDestPgsz(p)==SQLITE_NOMEM ){
      rc = SQLITE_NOMEM;
    }

    /* Lock the destination database, if it is not locked already. */
    if( SQLITE_OK==rc && p->bDestLocked==0
     && SQLITE_OK==(rc = sqlite3BtreeBeginTrans(p->pDest, 2,
                                                (int*)&p->iDestSchema)) 
    ){
      p->bDestLocked = 1;
    }

    /* Do not allow backup if the destination database is in WAL mode
    ** and the page sizes are different between source and destination */
    pgszSrc = sqlite3BtreeGetPageSize(p->pSrc);
    pgszDest = sqlite3BtreeGetPageSize(p->pDest);
    destMode = sqlite3PagerGetJournalMode(sqlite3BtreePager(p->pDest));
    if( SQLITE_OK==rc && destMode==PAGER_JOURNALMODE_WAL && pgszSrc!=pgszDest ){
      rc = SQLITE_READONLY;
    }
  
    /* Now that there is a read-lock on the source database, query the
    ** source pager for the number of pages in the database.
    */
    nSrcPage = (int)sqlite3BtreeLastPage(p->pSrc);
    assert( nSrcPage>=0 );
    for(ii=0; (nPage<0 || ii<nPage) && p->iNext<=(Pgno)nSrcPage && !rc; ii++){
      const Pgno iSrcPg = p->iNext;                 /* Source page number */
      if( iSrcPg!=PENDING_BYTE_PAGE(p->pSrc->pBt) ){
        DbPage *pSrcPg;                             /* Source page object */
        rc = sqlite3PagerGet(pSrcPager, iSrcPg, &pSrcPg,PAGER_GET_READONLY);
        if( rc==SQLITE_OK ){
          rc = backupOnePage(p, iSrcPg, sqlite3PagerGetData(pSrcPg), 0);
          sqlite3PagerUnref(pSrcPg);
        }
      }
      p->iNext++;
    }
    if( rc==SQLITE_OK ){
      p->nPagecount = nSrcPage;
      p->nRemaining = nSrcPage+1-p->iNext;
      if( p->iNext>(Pgno)nSrcPage ){
        rc = SQLITE_DONE;
      }else if( !p->isAttached ){
        attachBackupObject(p);
      }
    }
  
    /* Update the schema version field in the destination database. This
    ** is to make sure that the schema-version really does change in
    ** the case where the source and destination databases have the
    ** same schema version.
    */
    if( rc==SQLITE_DONE ){
      if( nSrcPage==0 ){
        rc = sqlite3BtreeNewDb(p->pDest);
        nSrcPage = 1;
      }
      if( rc==SQLITE_OK || rc==SQLITE_DONE ){
        rc = sqlite3BtreeUpdateMeta(p->pDest,1,p->iDestSchema+1);
      }
      if( rc==SQLITE_OK ){
        if( p->pDestDb ){
          sqlite3ResetAllSchemasOfConnection(p->pDestDb);
        }
        if( destMode==PAGER_JOURNALMODE_WAL ){
          rc = sqlite3BtreeSetVersion(p->pDest, 2);
        }
      }
      if( rc==SQLITE_OK ){
        int nDestTruncate;
        /* Set nDestTruncate to the final number of pages in the destination
        ** database. The complication here is that the destination page
        ** size may be different to the source page size. 
        **
        ** If the source page size is smaller than the destination page size, 
        ** round up. In this case the call to sqlite3OsTruncate() below will
        ** fix the size of the file. However it is important to call
        ** sqlite3PagerTruncateImage() here so that any pages in the 
        ** destination file that lie beyond the nDestTruncate page mark are
        ** journalled by PagerCommitPhaseOne() before they are destroyed
        ** by the file truncation.
        */
        assert( pgszSrc==sqlite3BtreeGetPageSize(p->pSrc) );
        assert( pgszDest==sqlite3BtreeGetPageSize(p->pDest) );
        if( pgszSrc<pgszDest ){
          int ratio = pgszDest/pgszSrc;
          nDestTruncate = (nSrcPage+ratio-1)/ratio;
          if( nDestTruncate==(int)PENDING_BYTE_PAGE(p->pDest->pBt) ){
            nDestTruncate--;
          }
        }else{
          nDestTruncate = nSrcPage * (pgszSrc/pgszDest);
        }
        assert( nDestTruncate>0 );

        if( pgszSrc<pgszDest ){
          /* If the source page-size is smaller than the destination page-size,
          ** two extra things may need to happen:
          **
          **   * The destination may need to be truncated, and
          **
          **   * Data stored on the pages immediately following the 
          **     pending-byte page in the source database may need to be
          **     copied into the destination database.
          */
          const i64 iSize = (i64)pgszSrc * (i64)nSrcPage;
          sqlite3_file * const pFile = sqlite3PagerFile(pDestPager);
          Pgno iPg;
          int nDstPage;
          i64 iOff;
          i64 iEnd;

          assert( pFile );
          assert( nDestTruncate==0 
              || (i64)nDestTruncate*(i64)pgszDest >= iSize || (
                nDestTruncate==(int)(PENDING_BYTE_PAGE(p->pDest->pBt)-1)
             && iSize>=PENDING_BYTE && iSize<=PENDING_BYTE+pgszDest
          ));

          /* This block ensures that all data required to recreate the original
          ** database has been stored in the journal for pDestPager and the
          ** journal synced to disk. So at this point we may safely modify
          ** the database file in any way, knowing that if a power failure
          ** occurs, the original database will be reconstructed from the 
          ** journal file.  */
          sqlite3PagerPagecount(pDestPager, &nDstPage);
          for(iPg=nDestTruncate; rc==SQLITE_OK && iPg<=(Pgno)nDstPage; iPg++){
            if( iPg!=PENDING_BYTE_PAGE(p->pDest->pBt) ){
              DbPage *pPg;
              rc = sqlite3PagerGet(pDestPager, iPg, &pPg, 0);
              if( rc==SQLITE_OK ){
                rc = sqlite3PagerWrite(pPg);
                sqlite3PagerUnref(pPg);
              }
            }
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 1);
          }

          /* Write the extra pages and truncate the database file as required */
          iEnd = MIN(PENDING_BYTE + pgszDest, iSize);
          for(
            iOff=PENDING_BYTE+pgszSrc; 
            rc==SQLITE_OK && iOff<iEnd; 
            iOff+=pgszSrc
          ){
            PgHdr *pSrcPg = 0;
            const Pgno iSrcPg = (Pgno)((iOff/pgszSrc)+1);
            rc = sqlite3PagerGet(pSrcPager, iSrcPg, &pSrcPg, 0);
            if( rc==SQLITE_OK ){
              u8 *zData = sqlite3PagerGetData(pSrcPg);
              rc = sqlite3OsWrite(pFile, zData, pgszSrc, iOff);
            }
            sqlite3PagerUnref(pSrcPg);
          }
          if( rc==SQLITE_OK ){
            rc = backupTruncateFile(pFile, iSize);
          }

          /* Sync the database file to disk. */
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerSync(pDestPager, 0);
          }
        }else{
          sqlite3PagerTruncateImage(pDestPager, nDestTruncate);
          rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 0);
        }
    
        /* Finish committing the transaction to the destination database. */
        if( SQLITE_OK==rc
         && SQLITE_OK==(rc = sqlite3BtreeCommitPhaseTwo(p->pDest, 0))
        ){
          rc = SQLITE_DONE;
        }
      }
    }
  
    /* If bCloseTrans is true, then this function opened a read transaction
    ** on the source database. Close the read transaction here. There is
    ** no need to check the return values of the btree methods here, as
    ** "committing" a read-only transaction cannot fail.
    */
    if( bCloseTrans ){
      TESTONLY( int rc2 );
      TESTONLY( rc2  = ) sqlite3BtreeCommitPhaseOne(p->pSrc, 0);
      TESTONLY( rc2 |= ) sqlite3BtreeCommitPhaseTwo(p->pSrc, 0);
      assert( rc2==SQLITE_OK );
    }
  
    if( rc==SQLITE_IOERR_NOMEM ){
      rc = SQLITE_NOMEM_BKPT;
    }
    p->rc = rc;
  }
  if( p->pDestDb ){
    sqlite3_mutex_leave(p->pDestDb->mutex);
  }
  sqlite3BtreeLeave(p->pSrc);
  sqlite3_mutex_leave(p->pSrcDb->mutex);
  return rc;
}